

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int session_process_headers_frame(nghttp2_session *session)

{
  int iVar1;
  nghttp2_inbound_frame *frame_00;
  nghttp2_stream *stream_00;
  nghttp2_stream *stream;
  nghttp2_frame *frame;
  nghttp2_inbound_frame *iframe;
  int rv;
  nghttp2_session *session_local;
  
  frame_00 = &session->iframe;
  iVar1 = nghttp2_frame_unpack_headers_payload
                    ((nghttp2_headers *)frame_00,(session->iframe).sbuf.pos);
  if (iVar1 == 0) {
    stream_00 = nghttp2_session_get_stream(session,(session->iframe).frame.hd.stream_id);
    if (stream_00 == (nghttp2_stream *)0x0) {
      (session->iframe).frame.headers.cat = NGHTTP2_HCAT_REQUEST;
      session_local._4_4_ = nghttp2_session_on_request_headers_received(session,&frame_00->frame);
    }
    else if (stream_00->state == NGHTTP2_STREAM_RESERVED) {
      (session->iframe).frame.headers.cat = NGHTTP2_HCAT_PUSH_RESPONSE;
      session_local._4_4_ =
           nghttp2_session_on_push_response_headers_received(session,&frame_00->frame,stream_00);
    }
    else {
      if ((stream_00->state == NGHTTP2_STREAM_OPENING) &&
         (iVar1 = nghttp2_session_is_my_stream_id(session,(session->iframe).frame.hd.stream_id),
         iVar1 != 0)) {
        (session->iframe).frame.headers.cat = NGHTTP2_HCAT_RESPONSE;
        iVar1 = nghttp2_session_on_response_headers_received(session,&frame_00->frame,stream_00);
        return iVar1;
      }
      (session->iframe).frame.headers.cat = NGHTTP2_HCAT_HEADERS;
      session_local._4_4_ = nghttp2_session_on_headers_received(session,&frame_00->frame,stream_00);
    }
  }
  else {
    session_local._4_4_ =
         nghttp2_session_terminate_session_with_reason(session,1,"HEADERS: could not unpack");
  }
  return session_local._4_4_;
}

Assistant:

static int session_process_headers_frame(nghttp2_session *session) {
  int rv;
  nghttp2_inbound_frame *iframe = &session->iframe;
  nghttp2_frame *frame = &iframe->frame;
  nghttp2_stream *stream;

  rv = nghttp2_frame_unpack_headers_payload(&frame->headers, iframe->sbuf.pos);

  if (rv != 0) {
    return nghttp2_session_terminate_session_with_reason(
        session, NGHTTP2_PROTOCOL_ERROR, "HEADERS: could not unpack");
  }
  stream = nghttp2_session_get_stream(session, frame->hd.stream_id);
  if (!stream) {
    frame->headers.cat = NGHTTP2_HCAT_REQUEST;
    return nghttp2_session_on_request_headers_received(session, frame);
  }

  if (stream->state == NGHTTP2_STREAM_RESERVED) {
    frame->headers.cat = NGHTTP2_HCAT_PUSH_RESPONSE;
    return nghttp2_session_on_push_response_headers_received(session, frame,
                                                             stream);
  }

  if (stream->state == NGHTTP2_STREAM_OPENING &&
      nghttp2_session_is_my_stream_id(session, frame->hd.stream_id)) {
    frame->headers.cat = NGHTTP2_HCAT_RESPONSE;
    return nghttp2_session_on_response_headers_received(session, frame, stream);
  }

  frame->headers.cat = NGHTTP2_HCAT_HEADERS;
  return nghttp2_session_on_headers_received(session, frame, stream);
}